

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O1

PVIPNode *
PVIP_node_new_children4
          (PVIPParserContext *parser,PVIP_node_type_t type,PVIPNode *n1,PVIPNode *n2,PVIPNode *n3,
          PVIPNode *n4)

{
  PVIPNode *node;
  
  if (n1 == (PVIPNode *)0x0) {
    __assert_fail("n1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                  ,0xf3,
                  "PVIPNode *PVIP_node_new_children4(PVIPParserContext *, PVIP_node_type_t, PVIPNode *, PVIPNode *, PVIPNode *, PVIPNode *)"
                 );
  }
  if (n2 == (PVIPNode *)0x0) {
    __assert_fail("n2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                  ,0xf4,
                  "PVIPNode *PVIP_node_new_children4(PVIPParserContext *, PVIP_node_type_t, PVIPNode *, PVIPNode *, PVIPNode *, PVIPNode *)"
                 );
  }
  if (n3 == (PVIPNode *)0x0) {
    __assert_fail("n3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                  ,0xf5,
                  "PVIPNode *PVIP_node_new_children4(PVIPParserContext *, PVIP_node_type_t, PVIPNode *, PVIPNode *, PVIPNode *, PVIPNode *)"
                 );
  }
  if (n4 != (PVIPNode *)0x0) {
    node = PVIP_node_new_children(parser,type);
    PVIP_node_push_child(node,n1);
    PVIP_node_push_child(node,n2);
    PVIP_node_push_child(node,n3);
    PVIP_node_push_child(node,n4);
    return node;
  }
  __assert_fail("n4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                ,0xf6,
                "PVIPNode *PVIP_node_new_children4(PVIPParserContext *, PVIP_node_type_t, PVIPNode *, PVIPNode *, PVIPNode *, PVIPNode *)"
               );
}

Assistant:

PVIPNode* PVIP_node_new_children4(PVIPParserContext* parser, PVIP_node_type_t type, PVIPNode* n1, PVIPNode *n2, PVIPNode *n3, PVIPNode *n4) {
    assert(n1);
    assert(n2);
    assert(n3);
    assert(n4);

    PVIPNode* node = PVIP_node_new_children(parser, type);
    PVIP_node_push_child(node, n1);
    PVIP_node_push_child(node, n2);
    PVIP_node_push_child(node, n3);
    PVIP_node_push_child(node, n4);
    return node;
}